

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::ADC(CPU *this,uint8_t argument)

{
  ushort uVar1;
  bool bVar2;
  uint16_t sum;
  uint8_t argument_local;
  CPU *this_local;
  
  uVar1 = (ushort)this->A + (ushort)argument + (ushort)((byte)this->field_0x2e >> 7);
  this->field_0x2e = this->field_0x2e & 0x7f | (0xff < uVar1) << 7;
  bVar2 = false;
  if (((this->A ^ argument) & 0x80) == 0) {
    bVar2 = ((this->A ^ uVar1) & 0x80) != 0;
  }
  this->field_0x2e = this->field_0x2e & 0xfd | bVar2 << 1;
  this->field_0x2e = this->field_0x2e & 0xbf | ((uVar1 & 0xff) == 0) << 6;
  this->field_0x2e = this->field_0x2e & 0xfe | (uVar1 & 0x80) != 0;
  this->A = (uint8_t)uVar1;
  return;
}

Assistant:

void CPU::ADC(uint8_t argument) {
	uint16_t sum = A + argument + C;
	C = (sum > 0xFF) ? 1 : 0;
	V = (!((A ^ argument) & (1 << 7)) && ((uint16_t(A) ^ sum) & (1 << 7))) ? 1 : 0;
	Z = ((sum & 0xFF) == 0) ? 1 : 0;
	N = (sum & (1 << 7)) ? 1 : 0;
	A = uint8_t(sum & 0xFF);
}